

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_queue_tail_multiple_relaxed.h
# Opt level: O2

uintptr_t __thiscall
density::detail::
LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
::page_overflow(LFQueue_Tail<density::runtime_type<density::f_move_construct,_density::f_destroy,_density::f_size,_density::f_alignment>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)1,_(density::consistency_model)0>
                *this,LfQueue_ProgressGuarantee i_progress_guarantee,uintptr_t i_tail)

{
  ulong uVar1;
  ulong uVar2;
  uintptr_t uVar3;
  bool bVar4;
  
  uVar1 = (i_tail & 0xffffffffffff0000) + 0xffc0;
  if (uVar1 <= i_tail) {
    uVar3 = get_or_allocate_next_page(this,i_progress_guarantee,i_tail);
    return uVar3;
  }
  LOCK();
  uVar2 = (this->m_tail).super___atomic_base<unsigned_long>._M_i;
  bVar4 = i_tail == uVar2;
  if (bVar4) {
    (this->m_tail).super___atomic_base<unsigned_long>._M_i = uVar1;
    uVar2 = i_tail;
  }
  UNLOCK();
  if (bVar4) {
    raw_atomic_store((uintptr_t *)i_tail,i_tail & 0xffffffffffff0000 | 0xffc2,memory_order_seq_cst);
    uVar2 = uVar1;
  }
  return uVar2;
}

Assistant:

DENSITY_NO_INLINE uintptr_t
                              page_overflow(LfQueue_ProgressGuarantee i_progress_guarantee, uintptr_t i_tail)
            {
                uintptr_t const page_end = get_end_control_block(i_tail);
                if (i_tail < page_end)
                {
                    /* There is space between the (presumed) current tail and the end control block.
                        We try to pad it with a dead element. */
                    uintptr_t expected_tail = i_tail;
                    if (m_tail.compare_exchange_weak(
                          expected_tail, page_end, mem_relaxed, mem_relaxed))
                    {
                        // m_tail was successfully updated, now we can setup the padding element
                        auto const block = reinterpret_cast<ControlBlock *>(i_tail);
                        raw_atomic_store(&block->m_next, page_end + LfQueue_Dead, mem_release);
                        return page_end;
                    }
                    else
                    {
                        // failed to allocate the padding, reenter the main loop
                        return expected_tail;
                    }
                }
                else
                {
                    // get or allocate a new page
                    DENSITY_ASSUME(i_tail == page_end);
                    return get_or_allocate_next_page(i_progress_guarantee, i_tail);
                }
            }